

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ga_solve_seq.c
# Opt level: O1

void LP_dgefa(double *a,int lda,int n,int *ipvt,int *info)

{
  undefined8 uVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  double *pdVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  double *pdVar15;
  ulong uVar16;
  double dVar17;
  double dVar18;
  
  *info = 0;
  uVar2 = n - 1;
  if (1 < n) {
    lVar4 = (long)lda;
    uVar8 = (ulong)(uint)n;
    pdVar7 = a + lVar4;
    uVar16 = 1;
    iVar14 = 0;
    uVar5 = 0;
    uVar9 = uVar8;
    pdVar15 = a;
    do {
      iVar3 = (int)uVar5;
      lVar10 = (long)(iVar3 * lda);
      if ((long)uVar5 < (long)uVar8) {
        iVar12 = 0;
        if (uVar8 - uVar5 != 1) {
          dVar17 = ABS(a[uVar5 + lVar10]);
          uVar13 = 0;
          uVar11 = 1;
          do {
            dVar18 = ABS(pdVar15[(long)iVar14 + uVar11]);
            if (dVar17 < dVar18) {
              uVar13 = uVar11 & 0xffffffff;
            }
            iVar12 = (int)uVar13;
            if (dVar18 <= dVar17) {
              dVar18 = dVar17;
            }
            dVar17 = dVar18;
            uVar11 = uVar11 + 1;
          } while (uVar9 != uVar11);
        }
      }
      else {
        iVar12 = -1;
      }
      iVar6 = iVar3 + iVar12;
      ipvt[uVar5] = iVar6;
      dVar17 = a[uVar5 * lVar4 + (long)iVar6];
      if ((dVar17 != 0.0) || (NAN(dVar17))) {
        if (iVar12 != 0) {
          a[uVar5 * lVar4 + (long)iVar6] = a[uVar5 + lVar10];
          a[uVar5 + lVar10] = dVar17;
        }
        lVar10 = 0;
        uVar11 = uVar8;
        do {
          if (iVar12 != 0) {
            uVar1 = *(undefined8 *)((long)pdVar7 + lVar10 + (long)iVar12 * 8);
            *(undefined8 *)((long)pdVar7 + lVar10 + (long)iVar12 * 8) =
                 *(undefined8 *)((long)pdVar7 + lVar10);
            *(undefined8 *)((long)pdVar7 + lVar10) = uVar1;
          }
          lVar10 = lVar10 + lVar4 * 8;
          uVar11 = uVar11 - 1;
        } while (uVar16 != uVar11);
      }
      else {
        *info = iVar3;
      }
      uVar5 = uVar5 + 1;
      uVar16 = uVar16 + 1;
      uVar9 = uVar9 - 1;
      pdVar15 = pdVar15 + 1;
      iVar14 = iVar14 + lda;
      pdVar7 = pdVar7 + lVar4 + 1;
    } while (uVar5 != uVar2);
  }
  ipvt[(int)uVar2] = uVar2;
  if ((a[(int)((lda + 1) * uVar2)] == 0.0) && (!NAN(a[(int)((lda + 1) * uVar2)]))) {
    *info = uVar2;
  }
  return;
}

Assistant:

void LP_dgefa(a,lda,n,ipvt,info)
REAL a[];
int lda,n,ipvt[],*info;

/* We would like to declare a[][lda], but c does not allow it.  In this
function, references to a[i][j] are written a[lda*i+j].  */
/*
     LP_dgefa factors a double precision matrix by gaussian elimination.

     LP_dgefa is usually called by dgeco, but it can be called
     directly with a saving in time if  rcond  is not needed.
     (time for dgeco) = (1 + 9/n)*(time for LP_dgefa) .

     on entry

        a       REAL precision[n][lda]
                the matrix to be factored.

        lda     integer
                the leading dimension of the array  a .

        n       integer
                the order of the matrix  a .

     on return

        a       an upper triangular matrix and the multipliers
                which were used to obtain it.
                the factorization can be written  a = l*u  where
                l  is a product of permutation and unit lower
                triangular matrices and  u  is upper triangular.

        ipvt    integer[n]
                an integer vector of pivot indices.

        info    integer
                = 0  normal value.
                = k  if  u[k][k] .eq. 0.0 .  this is not an error
                     condition for this subroutine, but it does
                     indicate that LP_dgesl or dgedi will divide by zero
                     if called.  use  rcond  in dgeco for a reliable
                     indication of singularity.

     linpack. this version dated 08/14/78 .
     cleve moler, university of new mexico, argonne national lab.

     functions

     blas LP_daxpy,LP_dscal,LP_idamax
*/

{
/*     internal variables	*/

  REAL t;
  int j,k,kp1,l,nm1;


/*     gaussian elimination with partial pivoting	*/
	*info = 0;
	nm1 = n - 1;
	if (nm1 >=  0) {
		for (k = 0; k < nm1; k++) {
			kp1 = k + 1;

          		/* find l = pivot index	*/

			l = LP_idamax(n-k,&a[lda*k+k],1) + k;
			ipvt[k] = l;

			/* zero pivot implies this column already 
			   triangularized */
			if (a[lda*k+l] != ZERO) {

				/* interchange if necessary */

				if (l != k) {
					t = a[lda*k+l];
					a[lda*k+l] = a[lda*k+k];
					a[lda*k+k] = t; 
				}

				/* compute multipliers */

				t = -ONE/a[lda*k+k];
				LP_dscal(n-(k+1),t,&a[lda*k+k+1],1);

				/* row elimination with column indexing */

				for (j = kp1; j < n; j++) {
					t = a[lda*j+l];
					if (l != k) {
						a[lda*j+l] = a[lda*j+k];
						a[lda*j+k] = t;
					}
					LP_daxpy(n-(k+1),t,&a[lda*k+k+1],1,
					      &a[lda*j+k+1],1);
  				} 
  			}
			else { 
            			*info = k;
			}
		} 
	}
	ipvt[n-1] = n-1;
	if (a[lda*(n-1)+(n-1)] == ZERO) *info = n-1;
}